

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# simple8b.h
# Opt level: O2

void __thiscall
FastPForLib::Simple8b<true>::encodeArray
          (Simple8b<true> *this,uint32_t *in,size_t length,uint32_t *out,size_t *nvalue)

{
  uint *puVar1;
  bool bVar2;
  uint uVar3;
  ulong uVar4;
  long lVar5;
  ulong uVar6;
  char cVar7;
  ulong *puVar8;
  long lStack_50;
  
  puVar8 = (ulong *)(out + 1);
  *out = (uint32_t)length;
  for (; 0xef < length; length = length + lStack_50) {
    bVar2 = trymefull<120u,0u>(in);
    if (bVar2) {
      bVar2 = trymefull<120u,0u>(in + 0x78);
      if (bVar2) {
        *puVar8 = 0;
        in = in + 0xf0;
        lStack_50 = -0xf0;
      }
      else {
        *puVar8 = 0x1000000000000000;
        lStack_50 = -0x78;
        in = in + 0x78;
      }
    }
    else {
      bVar2 = trymefull<60u,1u>(in);
      if (bVar2) {
        uVar4 = 2;
        for (lVar5 = 0; (int)lVar5 != 0x3c; lVar5 = lVar5 + 1) {
          uVar4 = uVar4 * 2 | (ulong)in[lVar5];
        }
        *puVar8 = uVar4;
        in = in + 0x3c;
        lStack_50 = -0x3c;
      }
      else {
        bVar2 = trymefull<30u,2u>(in);
        if (bVar2) {
          uVar4 = 3;
          for (lVar5 = 0; (int)lVar5 != 0x1e; lVar5 = lVar5 + 1) {
            uVar4 = uVar4 << 2 | (ulong)in[lVar5];
          }
          in = in + 0x1e;
          *puVar8 = uVar4;
          lStack_50 = -0x1e;
        }
        else {
          bVar2 = trymefull<20u,3u>(in);
          if (bVar2) {
            uVar4 = 4;
            for (lVar5 = 0; (int)lVar5 != 0x14; lVar5 = lVar5 + 1) {
              uVar4 = uVar4 << 3 | (ulong)in[lVar5];
            }
            in = in + 0x14;
            *puVar8 = uVar4;
            lStack_50 = -0x14;
          }
          else {
            bVar2 = trymefull<15u,4u>(in);
            if (bVar2) {
              uVar4 = 5;
              for (lVar5 = 0; (int)lVar5 != 0xf; lVar5 = lVar5 + 1) {
                uVar4 = uVar4 << 4 | (ulong)in[lVar5];
              }
              in = in + 0xf;
              *puVar8 = uVar4;
              lStack_50 = -0xf;
            }
            else {
              bVar2 = trymefull<12u,5u>(in);
              if (bVar2) {
                uVar4 = 6;
                for (lVar5 = 0; (int)lVar5 != 0xc; lVar5 = lVar5 + 1) {
                  uVar4 = uVar4 << 5 | (ulong)in[lVar5];
                }
                in = in + 0xc;
                *puVar8 = uVar4;
                lStack_50 = -0xc;
              }
              else {
                bVar2 = trymefull<10u,6u>(in);
                if (bVar2) {
                  uVar4 = 7;
                  for (lVar5 = 0; (int)lVar5 != 10; lVar5 = lVar5 + 1) {
                    uVar4 = uVar4 << 6 | (ulong)in[lVar5];
                  }
                  in = in + 10;
                  *puVar8 = uVar4;
                  lStack_50 = -10;
                }
                else {
                  bVar2 = trymefull<8u,7u>(in);
                  if (bVar2) {
                    uVar4 = 8;
                    for (lVar5 = 0; (int)lVar5 != 8; lVar5 = lVar5 + 1) {
                      uVar4 = uVar4 << 7 | (ulong)in[lVar5];
                    }
                    in = in + 8;
                    *puVar8 = uVar4 << 4;
                    lStack_50 = -8;
                  }
                  else {
                    bVar2 = trymefull<7u,8u>(in);
                    if (bVar2) {
                      uVar4 = 9;
                      for (lVar5 = 0; (int)lVar5 != 7; lVar5 = lVar5 + 1) {
                        uVar4 = uVar4 << 8 | (ulong)in[lVar5];
                      }
                      in = in + 7;
                      *puVar8 = uVar4 << 4;
                      lStack_50 = -7;
                    }
                    else {
                      bVar2 = trymefull<6u,10u>(in);
                      if (bVar2) {
                        uVar4 = 10;
                        for (lVar5 = 0; (int)lVar5 != 6; lVar5 = lVar5 + 1) {
                          uVar4 = uVar4 << 10 | (ulong)in[lVar5];
                        }
                        in = in + 6;
                        *puVar8 = uVar4;
                        lStack_50 = -6;
                      }
                      else {
                        bVar2 = trymefull<5u,12u>(in);
                        if (bVar2) {
                          uVar4 = 0xb;
                          for (lVar5 = 0; (int)lVar5 != 5; lVar5 = lVar5 + 1) {
                            uVar4 = uVar4 << 0xc | (ulong)in[lVar5];
                          }
                          in = in + 5;
                          *puVar8 = uVar4;
                          lStack_50 = -5;
                        }
                        else {
                          bVar2 = trymefull<4u,15u>(in);
                          if (bVar2) {
                            uVar4 = 0xc;
                            for (lVar5 = 0; (int)lVar5 != 4; lVar5 = lVar5 + 1) {
                              uVar4 = uVar4 << 0xf | (ulong)in[lVar5];
                            }
                            in = in + 4;
                            *puVar8 = uVar4;
                            lStack_50 = -4;
                          }
                          else {
                            bVar2 = trymefull<3u,20u>(in);
                            if (bVar2) {
                              uVar4 = 0xd;
                              for (lVar5 = 0; (int)lVar5 != 3; lVar5 = lVar5 + 1) {
                                uVar4 = uVar4 << 0x14 | (ulong)in[lVar5];
                              }
                              in = in + 3;
                              *puVar8 = uVar4;
                              lStack_50 = -3;
                            }
                            else {
                              uVar4 = (ulong)*in;
                              if ((uVar4 < 0x40000000) &&
                                 (puVar1 = in + 1, (ulong)*puVar1 < 0x40000000)) {
                                in = in + 2;
                                *puVar8 = (ulong)*puVar1 | 0xe000000000000000 | uVar4 << 0x1e;
                                lStack_50 = -2;
                              }
                              else {
                                in = in + 1;
                                *puVar8 = uVar4 | 0xf000000000000000;
                                lStack_50 = -1;
                              }
                            }
                          }
                        }
                      }
                    }
                  }
                }
              }
            }
          }
        }
      }
    }
    puVar8 = puVar8 + 1;
  }
  do {
    if (length == 0) {
      *nvalue = (long)puVar8 - (long)out >> 2;
      return;
    }
    bVar2 = tryme<240u,0u>(in,length);
    if (bVar2) {
      uVar4 = 0xf0;
      if (length < 0xf0) {
        uVar4 = length;
      }
      *puVar8 = 0;
LAB_0011b9e4:
      uVar3 = (uint)uVar4;
      in = in + (uVar4 & 0xffffffff);
    }
    else {
      bVar2 = tryme<120u,0u>(in,length);
      if (bVar2) {
        uVar4 = 0x78;
        if (length < 0x78) {
          uVar4 = length;
        }
        *puVar8 = 0x1000000000000000;
        goto LAB_0011b9e4;
      }
      bVar2 = tryme<60u,1u>(in,length);
      if (bVar2) {
        uVar4 = 0x3c;
        if (length < 0x3c) {
          uVar4 = length;
        }
        uVar3 = (uint)uVar4;
        uVar6 = 2;
        for (lVar5 = 0; uVar3 != (uint)lVar5; lVar5 = lVar5 + 1) {
          uVar6 = uVar6 * 2 | (ulong)in[lVar5];
        }
        in = (uint32_t *)((long)in + (ulong)(uVar3 * 4));
        uVar4 = (ulong)(byte)(0x3c - (char)uVar4);
        goto LAB_0011ba2f;
      }
      bVar2 = tryme<30u,2u>(in,length);
      if (bVar2) {
        uVar4 = 0x1e;
        if (length < 0x1e) {
          uVar4 = length;
        }
        uVar3 = (uint)uVar4;
        uVar6 = 3;
        for (lVar5 = 0; uVar3 != (uint)lVar5; lVar5 = lVar5 + 1) {
          uVar6 = uVar6 << 2 | (ulong)in[lVar5];
        }
        cVar7 = (char)uVar4 * '\x02';
LAB_0011ba7a:
        in = (uint32_t *)((long)in + (ulong)(uVar3 * 4));
        uVar4 = (ulong)(byte)(0x3c - cVar7);
LAB_0011bacb:
        uVar6 = uVar6 << (uVar4 & 0x3f);
LAB_0011bad0:
        *puVar8 = uVar6;
      }
      else {
        bVar2 = tryme<20u,3u>(in,length);
        if (bVar2) {
          uVar4 = 0x14;
          if (length < 0x14) {
            uVar4 = length;
          }
          uVar3 = (uint)uVar4;
          uVar6 = 4;
          for (lVar5 = 0; uVar3 != (uint)lVar5; lVar5 = lVar5 + 1) {
            uVar6 = uVar6 << 3 | (ulong)in[lVar5];
          }
          in = (uint32_t *)((long)in + (ulong)(uVar3 * 4));
          cVar7 = -3;
LAB_0011bac2:
          uVar4 = (ulong)(byte)((char)uVar3 * cVar7 + 0x3c);
          goto LAB_0011bacb;
        }
        bVar2 = tryme<15u,4u>(in,length);
        if (bVar2) {
          uVar4 = 0xf;
          if (length < 0xf) {
            uVar4 = length;
          }
          uVar3 = (uint)uVar4;
          uVar6 = 5;
          for (lVar5 = 0; uVar3 != (uint)lVar5; lVar5 = lVar5 + 1) {
            uVar6 = uVar6 << 4 | (ulong)in[lVar5];
          }
          in = (uint32_t *)((long)in + (ulong)(uVar3 * 4));
          uVar6 = uVar6 << ((ulong)(byte)(0x3c - (char)(uVar3 * 4)) & 0x3f);
          goto LAB_0011bad0;
        }
        bVar2 = tryme<12u,5u>(in,length);
        if (bVar2) {
          uVar4 = 0xc;
          if (length < 0xc) {
            uVar4 = length;
          }
          uVar3 = (uint)uVar4;
          uVar6 = 6;
          for (lVar5 = 0; uVar3 != (uint)lVar5; lVar5 = lVar5 + 1) {
            uVar6 = uVar6 << 5 | (ulong)in[lVar5];
          }
          in = (uint32_t *)((long)in + (ulong)(uVar3 * 4));
          cVar7 = -5;
          goto LAB_0011bac2;
        }
        bVar2 = tryme<10u,6u>(in,length);
        if (bVar2) {
          uVar4 = 10;
          if (length < 10) {
            uVar4 = length;
          }
          uVar3 = (uint)uVar4;
          uVar6 = 7;
          for (lVar5 = 0; uVar3 != (uint)lVar5; lVar5 = lVar5 + 1) {
            uVar6 = uVar6 << 6 | (ulong)in[lVar5];
          }
          cVar7 = -6;
LAB_0011bbb1:
          in = (uint32_t *)((long)in + (ulong)(uVar3 * 4));
          uVar4 = (ulong)(byte)((char)uVar3 * cVar7 + 0x3c);
          goto LAB_0011bacb;
        }
        bVar2 = tryme<8u,7u>(in,length);
        if (bVar2) {
          uVar6 = 8;
          uVar4 = uVar6;
          if (length < 8) {
            uVar4 = length;
          }
          uVar3 = (uint)uVar4;
          for (lVar5 = 0; uVar3 != (uint)lVar5; lVar5 = lVar5 + 1) {
            uVar6 = uVar6 << 7 | (ulong)in[lVar5];
          }
          in = (uint32_t *)((long)in + (ulong)(uVar3 * 4));
          cVar7 = -7;
          goto LAB_0011bac2;
        }
        bVar2 = tryme<7u,8u>(in,length);
        if (bVar2) {
          uVar4 = 7;
          if (length < 7) {
            uVar4 = length;
          }
          uVar3 = (uint)uVar4;
          uVar6 = 9;
          for (lVar5 = 0; uVar3 != (uint)lVar5; lVar5 = lVar5 + 1) {
            uVar6 = uVar6 << 8 | (ulong)in[lVar5];
          }
          cVar7 = (char)(uVar3 << 3);
          goto LAB_0011ba7a;
        }
        bVar2 = tryme<6u,10u>(in,length);
        if (bVar2) {
          uVar4 = 6;
          if (length < 6) {
            uVar4 = length;
          }
          uVar3 = (uint)uVar4;
          uVar6 = 10;
          for (lVar5 = 0; uVar3 != (uint)lVar5; lVar5 = lVar5 + 1) {
            uVar6 = uVar6 << 10 | (ulong)in[lVar5];
          }
          cVar7 = -10;
          goto LAB_0011bbb1;
        }
        bVar2 = tryme<5u,12u>(in,length);
        if (bVar2) {
          uVar4 = 5;
          if (length < 5) {
            uVar4 = length;
          }
          uVar3 = (uint)uVar4;
          uVar6 = 0xb;
          for (lVar5 = 0; uVar3 != (uint)lVar5; lVar5 = lVar5 + 1) {
            uVar6 = uVar6 << 0xc | (ulong)in[lVar5];
          }
          in = (uint32_t *)((long)in + (ulong)(uVar3 * 4));
          uVar4 = (ulong)(byte)((char)uVar4 * -0xc + 0x3c);
          goto LAB_0011bacb;
        }
        bVar2 = tryme<4u,15u>(in,length);
        if (bVar2) {
          uVar4 = 4;
          if (length < 4) {
            uVar4 = length;
          }
          uVar3 = (uint)uVar4;
          uVar6 = 0xc;
          for (lVar5 = 0; uVar3 != (uint)lVar5; lVar5 = lVar5 + 1) {
            uVar6 = uVar6 << 0xf | (ulong)in[lVar5];
          }
          in = (uint32_t *)((long)in + (ulong)(uVar3 * 4));
          cVar7 = -0xf;
          goto LAB_0011bac2;
        }
        bVar2 = tryme<3u,20u>(in,length);
        if (bVar2) {
          uVar4 = 3;
          if (length < 3) {
            uVar4 = length;
          }
          uVar3 = (uint)uVar4;
          uVar6 = 0xd;
          for (lVar5 = 0; uVar3 != (uint)lVar5; lVar5 = lVar5 + 1) {
            uVar6 = uVar6 << 0x14 | (ulong)in[lVar5];
          }
          in = (uint32_t *)((long)in + (ulong)(uVar3 * 4));
          uVar4 = (ulong)(byte)((char)uVar4 * -0x14 + 0x3c);
LAB_0011ba2f:
          uVar6 = uVar6 << (uVar4 & 0x3f);
          goto LAB_0011bad0;
        }
        bVar2 = tryme<2u,30u>(in,length);
        if (bVar2) {
          uVar3 = (length != 1) + 1;
          uVar6 = 0xe;
          for (lVar5 = 0; uVar3 != (uint)lVar5; lVar5 = lVar5 + 1) {
            uVar6 = uVar6 << 0x1e | (ulong)in[lVar5];
          }
          in = (uint32_t *)((long)in + (ulong)((uint)(length != 1) * 4 + 4));
          uVar4 = (ulong)(byte)((char)(-0x1e << (length != 1)) + 0x3c);
          goto LAB_0011ba2f;
        }
        uVar3 = *in;
        in = in + 1;
        *puVar8 = (ulong)uVar3 | 0xf000000000000000;
        uVar3 = 1;
      }
    }
    puVar8 = puVar8 + 1;
    length = length - uVar3;
  } while( true );
}

Assistant:

void Simple8b<MarkLength>::encodeArray(const uint32_t *in, const size_t length,
                                       uint32_t *out, size_t &nvalue) {
#ifndef NDEBUG
  const uint32_t *const initin(in);
#endif
  uint32_t NumberOfValuesCoded = 0;
  const uint32_t *const initout(out);
  if (MarkLength) {
    *out = static_cast<uint32_t>(length);
    ++out;
  }
  // this may lead to unaligned access. Performance may be affected.
  // not much of an effect in practice on recent Intel processors.
  uint64_t *out64 = reinterpret_cast<uint64_t *>(out);
  size_t ValuesRemaining(length);
  // precompute
  const bool becareful(false);
  while (ValuesRemaining >= 240) {
    if (trymefull<120, 0>(in)) {
      if (trymefull<120, 0>(in + 120)) {
        NumberOfValuesCoded = 240;
        out64[0] = 0;
        in += NumberOfValuesCoded;
        if (becareful)
          assert(which(out64) == 0);

      } else {
        NumberOfValuesCoded = 120;
        out64[0] = 1ULL << (64 - SIMPLE8B_LOGDESC);
        in += NumberOfValuesCoded;
        if (becareful)
          assert(which(out64) == 1);
      }
    } else if (trymefull<60, 1>(in)) {
      out64[0] = 2;
      NumberOfValuesCoded = 60;
      for (uint32_t i = 0; i < 60; i++) {
        bit_writer(out64, *in++, 1);
      }
      out64[0] <<= 64 - SIMPLE8B_LOGDESC - 1 * 60;
      if (becareful)
        assert(which(out64) == 2);
    } else if (trymefull<30, 2>(in)) {
      out64[0] = 3;
      NumberOfValuesCoded = 30;
      for (uint32_t i = 0; i < 30; i++)
        bit_writer(out64, *in++, 2);
      out64[0] <<= 64 - SIMPLE8B_LOGDESC - 2 * 30;
      if (becareful)
        assert(which(out64) == 3);
    } else if (trymefull<20, 3>(in)) {
      out64[0] = 4;
      NumberOfValuesCoded = 20;
      for (uint32_t i = 0; i < 20; i++)
        bit_writer(out64, *in++, 3);
      out64[0] <<= 64 - SIMPLE8B_LOGDESC - 3 * 20;
      if (becareful)
        assert(which(out64) == 4);
    } else if (trymefull<15, 4>(in)) {
      out64[0] = 5;
      NumberOfValuesCoded = 15;
      for (uint32_t i = 0; i < 15; i++)
        bit_writer(out64, *in++, 4);
      out64[0] <<= 64 - SIMPLE8B_LOGDESC - 4 * 15;
      if (becareful)
        assert(which(out64) == 5);
    } else if (trymefull<12, 5>(in)) {
      out64[0] = 6;
      NumberOfValuesCoded = 12;
      for (uint32_t i = 0; i < NumberOfValuesCoded; i++)
        bit_writer(out64, *in++, 5);
      out64[0] <<= 64 - SIMPLE8B_LOGDESC - 5 * 12;
      if (becareful)
        assert(which(out64) == 6);
    } else if (trymefull<10, 6>(in)) {
      out64[0] = 7;
      NumberOfValuesCoded = 10;
      for (uint32_t i = 0; i < NumberOfValuesCoded; i++)
        bit_writer(out64, *in++, 6);
      out64[0] <<= 64 - SIMPLE8B_LOGDESC - 6 * 10;
      if (becareful)
        assert(which(out64) == 7);
    } else if (trymefull<8, 7>(in)) {
      out64[0] = 8;
      NumberOfValuesCoded = 8;
      for (uint32_t i = 0; i < NumberOfValuesCoded; i++)
        bit_writer(out64, *in++, 7);
      out64[0] <<= 64 - SIMPLE8B_LOGDESC - 7 * 8;
      if (becareful)
        assert(which(out64) == 8);
    } else if (trymefull<7, 8>(in)) {
      out64[0] = 9;
      NumberOfValuesCoded = 7;
      for (uint32_t i = 0; i < NumberOfValuesCoded; i++)
        bit_writer(out64, *in++, 8);
      out64[0] <<= 64 - SIMPLE8B_LOGDESC - 8 * 7;
      if (becareful)
        assert(which(out64) == 9);
    } else if (trymefull<6, 10>(in)) {
      out64[0] = 10;
      NumberOfValuesCoded = 6;
      for (uint32_t i = 0; i < NumberOfValuesCoded; i++)
        bit_writer(out64, *in++, 10);
      out64[0] <<= 64 - SIMPLE8B_LOGDESC - 10 * 6;
      if (becareful)
        assert(which(out64) == 10);
    } else if (trymefull<5, 12>(in)) {
      out64[0] = 11;
      NumberOfValuesCoded =
          (ValuesRemaining < 5) ? static_cast<uint32_t>(ValuesRemaining) : 5;
      for (uint32_t i = 0; i < NumberOfValuesCoded; i++)
        bit_writer(out64, *in++, 12);
      out64[0] <<= 64 - SIMPLE8B_LOGDESC - 12 * NumberOfValuesCoded;
      if (becareful)
        assert(which(out64) == 11);
    } else if (trymefull<4, 15>(in)) {
      out64[0] = 12;
      NumberOfValuesCoded = 4;
      for (uint32_t i = 0; i < NumberOfValuesCoded; i++)
        bit_writer(out64, *in++, 15);
      out64[0] <<= 64 - SIMPLE8B_LOGDESC - 15 * 4;
      if (becareful)
        assert(which(out64) == 12);
    } else if (trymefull<3, 20>(in)) {
      out64[0] = 13;
      NumberOfValuesCoded = 3;
      for (uint32_t i = 0; i < NumberOfValuesCoded; i++)
        bit_writer(out64, *in++, 20);
      out64[0] <<= 64 - SIMPLE8B_LOGDESC - 20 * 3;
      if (becareful)
        assert(which(out64) == 13);
    } else if (trymefull<2, 30>(in)) {
      out64[0] = 14;
      NumberOfValuesCoded = 2;
      for (uint32_t i = 0; i < NumberOfValuesCoded; i++)
        bit_writer(out64, *in++, 30);
      out64[0] <<= 64 - SIMPLE8B_LOGDESC - 30 * 2;
      if (becareful)
        assert(which(out64) == 14);
    } else if (trymefull<1, 60>(in)) {
      out64[0] = 15;
      NumberOfValuesCoded = 1;
      for (uint32_t i = 0; i < NumberOfValuesCoded; i++)
        bit_writer(out64, *in++, 60);
      out64[0] <<= 64 - SIMPLE8B_LOGDESC - 60 * 1;
      if (becareful)
        assert(which(out64) == 15);
    } else {
      throw std::logic_error("shouldn't happen");
    }
    ++out64;

    ValuesRemaining -= NumberOfValuesCoded;
  }

  while (ValuesRemaining > 0) {
    if (tryme<240, 0>(in, ValuesRemaining)) {
      NumberOfValuesCoded = (ValuesRemaining < 240)
                                ? static_cast<uint32_t>(ValuesRemaining)
                                : 240;
      out64[0] = 0;
      in += NumberOfValuesCoded;
      if (becareful)
        assert(which(out64) == 0);
    } else if (tryme<120, 0>(in, ValuesRemaining)) {
      NumberOfValuesCoded = (ValuesRemaining < 120)
                                ? static_cast<uint32_t>(ValuesRemaining)
                                : 120;
      out64[0] = 1ULL << (64 - SIMPLE8B_LOGDESC);
      in += NumberOfValuesCoded;
      if (becareful)
        assert(which(out64) == 1);
    } else if (tryme<60, 1>(in, ValuesRemaining)) {
      out64[0] = 2;
      NumberOfValuesCoded =
          (ValuesRemaining < 60) ? static_cast<uint32_t>(ValuesRemaining) : 60;
      for (uint32_t i = 0; i < NumberOfValuesCoded; i++) {
        bit_writer(out64, *in++, 1);
      }
      out64[0] <<= 64 - SIMPLE8B_LOGDESC - 1 * NumberOfValuesCoded;
      if (becareful)
        assert(which(out64) == 2);
    } else if (tryme<30, 2>(in, ValuesRemaining)) {
      out64[0] = 3;
      NumberOfValuesCoded =
          (ValuesRemaining < 30) ? static_cast<uint32_t>(ValuesRemaining) : 30;
      for (uint32_t i = 0; i < NumberOfValuesCoded; i++)
        bit_writer(out64, *in++, 2);
      out64[0] <<= 64 - SIMPLE8B_LOGDESC - 2 * NumberOfValuesCoded;
      if (becareful)
        assert(which(out64) == 3);
    } else if (tryme<20, 3>(in, ValuesRemaining)) {
      out64[0] = 4;
      NumberOfValuesCoded =
          (ValuesRemaining < 20) ? static_cast<uint32_t>(ValuesRemaining) : 20;
      for (uint32_t i = 0; i < NumberOfValuesCoded; i++)
        bit_writer(out64, *in++, 3);
      out64[0] <<= 64 - SIMPLE8B_LOGDESC - 3 * NumberOfValuesCoded;
      if (becareful)
        assert(which(out64) == 4);
    } else if (tryme<15, 4>(in, ValuesRemaining)) {
      out64[0] = 5;
      NumberOfValuesCoded =
          (ValuesRemaining < 15) ? static_cast<uint32_t>(ValuesRemaining) : 15;
      for (uint32_t i = 0; i < NumberOfValuesCoded; i++)
        bit_writer(out64, *in++, 4);
      out64[0] <<= 64 - SIMPLE8B_LOGDESC - 4 * NumberOfValuesCoded;
      if (becareful)
        assert(which(out64) == 5);
    } else if (tryme<12, 5>(in, ValuesRemaining)) {
      out64[0] = 6;
      NumberOfValuesCoded =
          (ValuesRemaining < 12) ? static_cast<uint32_t>(ValuesRemaining) : 12;
      for (uint32_t i = 0; i < NumberOfValuesCoded; i++)
        bit_writer(out64, *in++, 5);
      out64[0] <<= 64 - SIMPLE8B_LOGDESC - 5 * NumberOfValuesCoded;
      if (becareful)
        assert(which(out64) == 6);
    } else if (tryme<10, 6>(in, ValuesRemaining)) {
      out64[0] = 7;
      NumberOfValuesCoded =
          (ValuesRemaining < 10) ? static_cast<uint32_t>(ValuesRemaining) : 10;
      for (uint32_t i = 0; i < NumberOfValuesCoded; i++)
        bit_writer(out64, *in++, 6);
      out64[0] <<= 64 - SIMPLE8B_LOGDESC - 6 * NumberOfValuesCoded;
      if (becareful)
        assert(which(out64) == 7);
    } else if (tryme<8, 7>(in, ValuesRemaining)) {
      out64[0] = 8;
      NumberOfValuesCoded =
          (ValuesRemaining < 8) ? static_cast<uint32_t>(ValuesRemaining) : 8;
      for (uint32_t i = 0; i < NumberOfValuesCoded; i++)
        bit_writer(out64, *in++, 7);
      out64[0] <<= 64 - SIMPLE8B_LOGDESC - 7 * NumberOfValuesCoded;
      if (becareful)
        assert(which(out64) == 8);
    } else if (tryme<7, 8>(in, ValuesRemaining)) {
      out64[0] = 9;
      NumberOfValuesCoded =
          (ValuesRemaining < 7) ? static_cast<uint32_t>(ValuesRemaining) : 7;
      for (uint32_t i = 0; i < NumberOfValuesCoded; i++)
        bit_writer(out64, *in++, 8);
      out64[0] <<= 64 - SIMPLE8B_LOGDESC - 8 * NumberOfValuesCoded;
      if (becareful)
        assert(which(out64) == 9);
    } else if (tryme<6, 10>(in, ValuesRemaining)) {
      out64[0] = 10;
      NumberOfValuesCoded =
          (ValuesRemaining < 6) ? static_cast<uint32_t>(ValuesRemaining) : 6;
      for (uint32_t i = 0; i < NumberOfValuesCoded; i++)
        bit_writer(out64, *in++, 10);
      out64[0] <<= 64 - SIMPLE8B_LOGDESC - 10 * NumberOfValuesCoded;
      if (becareful)
        assert(which(out64) == 10);
    } else if (tryme<5, 12>(in, ValuesRemaining)) {
      out64[0] = 11;
      NumberOfValuesCoded =
          (ValuesRemaining < 5) ? static_cast<uint32_t>(ValuesRemaining) : 5;
      for (uint32_t i = 0; i < NumberOfValuesCoded; i++)
        bit_writer(out64, *in++, 12);
      out64[0] <<= 64 - SIMPLE8B_LOGDESC - 12 * NumberOfValuesCoded;
      if (becareful)
        assert(which(out64) == 11);
    } else if (tryme<4, 15>(in, ValuesRemaining)) {
      out64[0] = 12;
      NumberOfValuesCoded =
          (ValuesRemaining < 4) ? static_cast<uint32_t>(ValuesRemaining) : 4;
      for (uint32_t i = 0; i < NumberOfValuesCoded; i++)
        bit_writer(out64, *in++, 15);
      out64[0] <<= 64 - SIMPLE8B_LOGDESC - 15 * NumberOfValuesCoded;
      if (becareful)
        assert(which(out64) == 12);
    } else if (tryme<3, 20>(in, ValuesRemaining)) {
      out64[0] = 13;
      NumberOfValuesCoded =
          (ValuesRemaining < 3) ? static_cast<uint32_t>(ValuesRemaining) : 3;
      for (uint32_t i = 0; i < NumberOfValuesCoded; i++)
        bit_writer(out64, *in++, 20);
      out64[0] <<= 64 - SIMPLE8B_LOGDESC - 20 * NumberOfValuesCoded;
      if (becareful)
        assert(which(out64) == 13);
    } else if (tryme<2, 30>(in, ValuesRemaining)) {
      out64[0] = 14;
      NumberOfValuesCoded =
          (ValuesRemaining < 2) ? static_cast<uint32_t>(ValuesRemaining) : 2;
      for (uint32_t i = 0; i < NumberOfValuesCoded; i++)
        bit_writer(out64, *in++, 30);
      out64[0] <<= 64 - SIMPLE8B_LOGDESC - 30 * NumberOfValuesCoded;
      if (becareful)
        assert(which(out64) == 14);
    } else if (tryme<1, 60>(in, ValuesRemaining)) {
      out64[0] = 15;
      NumberOfValuesCoded = (ValuesRemaining < 1) ? uint32_t(ValuesRemaining) : 1;
      for (uint32_t i = 0; i < NumberOfValuesCoded; i++)
        bit_writer(out64, *in++, 60);
      out64[0] <<= 64 - SIMPLE8B_LOGDESC - 60 * NumberOfValuesCoded;
      if (becareful)
        assert(which(out64) == 15);
    } else {
      throw std::logic_error("shouldn't happen");
    }
    if (becareful)
      ASSERT(initin + length - ValuesRemaining + NumberOfValuesCoded == in,
          std::to_string(which(out64)));
    ++out64;

    ValuesRemaining -= NumberOfValuesCoded;
  }
  assert(initin + length == in);
  nvalue = reinterpret_cast<uint32_t *>(out64) - initout;
}